

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedTimeZone::operator==(RuleBasedTimeZone *this,TimeZone *that)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  UBool UVar3;
  
  UVar3 = '\x01';
  if (this != (RuleBasedTimeZone *)that) {
    __s1 = *(char **)((this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[-1] + 8
                     );
    __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
    if ((((__s1 != __s2) && ((*__s1 == '*' || (iVar2 = strcmp(__s1,__s2), iVar2 != 0)))) ||
        (UVar1 = TimeZone::operator==((TimeZone *)this,that), UVar1 == '\0')) ||
       (((iVar2 = (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[5])
                            (this->fInitialRule,that[1].super_UObject._vptr_UObject),
         (char)iVar2 != '\0' ||
         (UVar1 = compareRules(this->fHistoricRules,
                               (UVector *)that[1].fID.super_Replaceable.super_UObject._vptr_UObject)
         , UVar1 == '\0')) ||
        (UVar1 = compareRules(this->fFinalRules,*(UVector **)&that[1].fID.fUnion), UVar1 == '\0'))))
    {
      UVar3 = '\0';
    }
  }
  return UVar3;
}

Assistant:

UBool
RuleBasedTimeZone::operator==(const TimeZone& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)
        || BasicTimeZone::operator==(that) == FALSE) {
        return FALSE;
    }
    RuleBasedTimeZone *rbtz = (RuleBasedTimeZone*)&that;
    if (*fInitialRule != *(rbtz->fInitialRule)) {
        return FALSE;
    }
    if (compareRules(fHistoricRules, rbtz->fHistoricRules)
        && compareRules(fFinalRules, rbtz->fFinalRules)) {
        return TRUE;
    }
    return FALSE;
}